

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dfs_range2(int head,int cur,int len)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> a;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_28
  ;
  int *local_20;
  int *v;
  int i;
  int len_local;
  int cur_local;
  int head_local;
  
  vis[cur] = true;
  v._4_4_ = len;
  i = cur;
  len_local = head;
  for (v._0_4_ = 0; (int)v < inDegrees[i]; v._0_4_ = (int)v + 1) {
    local_20 = Ginv[i] + (int)v;
    if ((len_local <= *local_20) && ((vis[*local_20] & 1U) == 0)) {
      isValid[*local_20] = len_local + 100;
      if (v._4_4_ == 2) {
        isTail[*local_20] = -100 - len_local;
        pvVar2 = std::
                 vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 ::operator[](&pre,(long)len_local);
        local_28._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::find(pvVar2,local_20);
        pvVar2 = std::
                 vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 ::operator[](&pre,(long)len_local);
        a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)std::
                      unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::end(pvVar2);
        bVar1 = std::__detail::operator==
                          (&local_28,
                           (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                            *)&a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          std::allocator<int>::allocator(&local_49);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_48,1,&i,&local_49);
          std::allocator<int>::~allocator(&local_49);
          pvVar2 = std::
                   vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                   ::operator[](&pre,(long)len_local);
          pmVar3 = std::
                   unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[](pvVar2,local_20);
          std::vector<int,_std::allocator<int>_>::operator=
                    (pmVar3,(vector<int,_std::allocator<int>_> *)local_48);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_48);
        }
        else {
          pvVar2 = std::
                   vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                   ::operator[](&pre,(long)len_local);
          pmVar3 = std::
                   unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[](pvVar2,local_20);
          std::vector<int,_std::allocator<int>_>::push_back(pmVar3,&i);
        }
      }
      if (v._4_4_ < 3) {
        dfs_range2(len_local,*local_20,v._4_4_ + 1);
      }
    }
  }
  vis[i] = false;
  return;
}

Assistant:

void dfs_range2(int head, int cur, int len) {
    vis[cur] = true;
    for (int i = 0; i < inDegrees[cur]; ++i) {
        int &v = Ginv[cur][i];
        if (v < head || vis[v])continue;
        isValid[v] = head + 100;
        if (len == 2) {
            isTail[v] = -100 - head;
            if (pre[head].find(v) == pre[head].end()) {
                vector<int> a(1, cur);
                pre[head][v] = a;
            } else {
                pre[head][v].push_back(cur);
            }
        }
        if (len >= 3)continue;
        dfs_range2(head, v, len + 1);
    }
    vis[cur] = false;
}